

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChiliException.h
# Opt level: O0

wstring * __thiscall
ChiliException::GetLocation_abi_cxx11_(wstring *__return_storage_ptr__,ChiliException *this)

{
  wstring local_b0;
  allocator<wchar_t> local_79;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  ChiliException *local_18;
  ChiliException *this_local;
  
  local_18 = this;
  this_local = (ChiliException *)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_78,L"Line [",&local_79);
  std::__cxx11::to_wstring(&local_b0,this->line);
  std::operator+(&local_58,&local_78,&local_b0);
  std::operator+(&local_38,&local_58,L"] in ");
  std::operator+(__return_storage_ptr__,&local_38,&this->file);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_b0);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  std::allocator<wchar_t>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::wstring GetLocation() const
	{
		return std::wstring( L"Line [" ) + std::to_wstring( line ) + L"] in " + file;
	}